

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  size_t _elemsize;
  float *pfVar5;
  void *pvVar6;
  int k;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  void *pvVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  int i_3;
  ulong uVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  int local_160;
  Mat top_blob_bordered;
  Mat out;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m;
  
  uVar3 = bottom_blob->w;
  uVar25 = bottom_blob->h;
  iVar4 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar18 = (this->kernel_w + -1) * this->dilation_w + (uVar3 - 1) * this->stride_w + 1;
  iVar7 = (uVar25 - 1) * this->stride_h + (this->kernel_h + -1) * this->dilation_h + 1;
  top_blob_bordered.elemsize._0_4_ = 0;
  top_blob_bordered.elemsize._4_4_ = 0;
  top_blob_bordered.packing = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  iVar9 = -100;
  if ((this->pad_w < 1) && (this->pad_h < 1)) {
    Mat::operator=(&top_blob_bordered,top_blob);
    Mat::create(&top_blob_bordered,iVar18,iVar7,this->num_output,_elemsize,opt->blob_allocator);
  }
  else {
    Mat::create(&top_blob_bordered,iVar18,iVar7,this->num_output,_elemsize,opt->workspace_allocator)
    ;
  }
  if ((top_blob_bordered.data == (void *)0x0) ||
     ((long)top_blob_bordered.c * top_blob_bordered.cstep == 0)) goto LAB_00123f87;
  uVar8 = this->kernel_w * this->kernel_h;
  std::vector<int,_std::allocator<int>_>::vector
            (&_space_ofs,(long)(int)uVar8,(allocator_type *)&out);
  iVar9 = this->dilation_h;
  iVar14 = this->kernel_w;
  iVar15 = this->dilation_w * iVar14;
  iVar20 = 0;
  lVar21 = 0;
  for (iVar16 = 0; iVar16 < this->kernel_h; iVar16 = iVar16 + 1) {
    for (lVar22 = 0; (int)lVar22 < iVar14; lVar22 = lVar22 + 1) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)lVar21 + lVar22] = iVar20;
      iVar20 = iVar20 + this->dilation_w;
      iVar14 = this->kernel_w;
    }
    iVar20 = iVar20 + (iVar9 * iVar18 - iVar15);
    lVar21 = (int)lVar21 + lVar22;
  }
  uVar23 = 0;
  uVar24 = 0;
  if (0 < (int)uVar8) {
    uVar24 = (ulong)uVar8;
  }
  iVar9 = 0;
  if (0 < iVar4) {
    iVar9 = iVar4;
  }
  uVar10 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar10 = uVar23;
  }
  uVar11 = (ulong)uVar25;
  if ((int)uVar25 < 1) {
    uVar11 = uVar23;
  }
  uVar12 = (ulong)(uint)(iVar7 * iVar18);
  if (iVar7 * iVar18 < 1) {
    uVar12 = uVar23;
  }
  for (lVar21 = 0; lVar21 < this->num_output; lVar21 = lVar21 + 1) {
    out.elemsize = CONCAT44(top_blob_bordered.elemsize._4_4_,(undefined4)top_blob_bordered.elemsize)
    ;
    out.data = (void *)(top_blob_bordered.cstep * lVar21 * out.elemsize +
                       (long)top_blob_bordered.data);
    out.refcount = (int *)0x0;
    out.packing = top_blob_bordered.packing;
    out.allocator = top_blob_bordered.allocator;
    out.dims = 2;
    out.w = top_blob_bordered.w;
    out.h = top_blob_bordered.h;
    out.c = 1;
    out.cstep = (size_t)(top_blob_bordered.h * top_blob_bordered.w);
    if (this->bias_term == 0) {
      fVar26 = 0.0;
    }
    else {
      fVar26 = *(float *)((long)(this->bias_data).data + lVar21 * 4);
    }
    Mat::fill(&out,fVar26);
    for (iVar7 = 0; pvVar6 = out.data, local_160 = (int)uVar11, iVar7 != local_160;
        iVar7 = iVar7 + 1) {
      for (uVar17 = 0; pvVar6 = out.data, uVar17 != uVar10; uVar17 = uVar17 + 1) {
        lVar22 = (long)(int)uVar17 * (long)this->stride_w * 4 +
                 (long)out.w * (long)this->stride_h * (long)iVar7 * out.elemsize;
        pvVar19 = (void *)((long)(this->weight_data).data + (long)(int)uVar23 * 4);
        for (iVar18 = 0; iVar18 != iVar9; iVar18 = iVar18 + 1) {
          Mat::channel(&m,bottom_blob,iVar18);
          fVar26 = *(float *)((long)m.data + uVar17 * 4 + (long)m.w * (long)iVar7 * m.elemsize);
          for (uVar13 = 0; uVar24 != uVar13; uVar13 = uVar13 + 1) {
            *(float *)((long)pvVar6 +
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar13] * 4 + lVar22) =
                 *(float *)((long)pvVar19 + uVar13 * 4) * fVar26 +
                 *(float *)((long)pvVar6 +
                           (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar13] * 4 + lVar22);
          }
          Mat::~Mat(&m);
          pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar8 * 4);
        }
      }
    }
    switch(this->activation_type) {
    case 1:
      for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
        fVar26 = *(float *)((long)out.data + uVar17 * 4);
        if (fVar26 <= 0.0) {
          fVar26 = 0.0;
        }
        *(float *)((long)out.data + uVar17 * 4) = fVar26;
      }
      break;
    case 2:
      uVar3 = *(this->activation_params).data;
      for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
        fVar26 = *(float *)((long)out.data + uVar17 * 4);
        uVar25 = -(uint)(0.0 < fVar26);
        *(float *)((long)out.data + uVar17 * 4) =
             (float)(~uVar25 & uVar3 | uVar25 & 0x3f800000) * fVar26;
      }
      break;
    case 3:
      pfVar5 = (float *)(this->activation_params).data;
      fVar26 = *pfVar5;
      fVar1 = pfVar5[1];
      for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
        fVar2 = *(float *)((long)out.data + uVar17 * 4);
        fVar27 = fVar2;
        if (fVar2 <= fVar26) {
          fVar27 = fVar26;
        }
        if ((fVar2 < fVar26) || (fVar1 < fVar27)) {
          if (fVar1 <= fVar27) {
            fVar27 = fVar1;
          }
          *(float *)((long)out.data + uVar17 * 4) = fVar27;
        }
      }
      break;
    case 4:
      for (uVar17 = 0; uVar12 != uVar17; uVar17 = uVar17 + 1) {
        fVar26 = expf(-*(float *)((long)pvVar6 + uVar17 * 4));
        *(float *)((long)pvVar6 + uVar17 * 4) = 1.0 / (fVar26 + 1.0);
      }
    }
    Mat::~Mat(&out);
    uVar23 = (ulong)((int)uVar23 + iVar4 * uVar8);
  }
  iVar4 = this->pad_w;
  iVar9 = this->pad_h;
  if (iVar9 < 1 && iVar4 < 1) {
    Mat::operator=(top_blob,&top_blob_bordered);
LAB_00123f78:
    iVar9 = 0;
  }
  else {
    copy_cut_border(&top_blob_bordered,top_blob,iVar9,iVar9,iVar4,iVar4,opt->blob_allocator,
                    opt->num_threads);
    iVar9 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
    goto LAB_00123f78;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
LAB_00123f87:
  Mat::~Mat(&top_blob_bordered);
  return iVar9;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_w > 0 || pad_h > 0)
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = 1.f / (1.f + exp(-outptr[i]));
            }
        }
    }

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w, opt.blob_allocator, opt.num_threads);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}